

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O2

void __thiscall BindRnase::Execute(BindRnase *this)

{
  _func_int **pp_Var1;
  SpeciesTracker *this_00;
  Ptr polymer;
  shared_ptr<Rnase> new_pol;
  _func_int **local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_58 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  undefined1 local_38 [16];
  shared_ptr<Reaction> local_28;
  
  Bind::ChoosePolymer((Bind *)&local_68);
  std::make_shared<Rnase,Rnase_const&>((Rnase *)local_58);
  pp_Var1 = local_68;
  std::__shared_ptr<MobileElement,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Rnase,void>
            ((__shared_ptr<MobileElement,(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x10),
             (__shared_ptr<Rnase,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  (**(code **)(*pp_Var1 + 8))
            (pp_Var1,(__shared_ptr<MobileElement,(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x10),
             &(this->super_Bind).promoter_name_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  this_00 = SpeciesTracker::Instance();
  std::__shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2> *)local_38,local_68 + 10);
  local_28.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_38._0_8_;
  local_28.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_;
  local_38._0_8_ = (element_type *)0x0;
  local_38._8_8_ = (pointer)0x0;
  Signal<std::shared_ptr<Reaction>_>::Emit(&this_00->propensity_signal_,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  return;
}

Assistant:

void BindRnase::Execute() {
  auto polymer = ChoosePolymer();
  auto new_pol = std::make_shared<Rnase>(pol_template_);
  polymer->Bind(new_pol, promoter_name_);
  SpeciesTracker::Instance().propensity_signal_.Emit(polymer->wrapper());
}